

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O1

bool __thiscall CppJieba::Trie::_deleteNode(Trie *this,TrieNode *node)

{
  _Hash_node_base *p_Var1;
  
  for (p_Var1 = (node->hmap)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    _deleteNode(this,(TrieNode *)p_Var1[2]._M_nxt);
  }
  std::
  _Hashtable<unsigned_short,_std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_short,_std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)node);
  operator_delete(node);
  return true;
}

Assistant:

bool _deleteNode(TrieNode* node)
            {
                for(TrieNodeMap::iterator it = node->hmap.begin(); it != node->hmap.end(); it++)
                {
                    TrieNode* next = it->second;
                    _deleteNode(next);
                }

                delete node;
                return true;
            }